

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gls::StateChangePerformanceCase::iterate(StateChangePerformanceCase *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  int iVar3;
  deUint32 dVar4;
  pointer puVar5;
  undefined4 extraout_var;
  deUint64 dVar7;
  deUint64 dVar8;
  undefined4 extraout_var_00;
  pointer puVar9;
  ulong uVar10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  iterator __position;
  undefined1 local_1b0 [384];
  long lVar6;
  
  puVar9 = (this->m_interleavedResults).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (this->m_interleavedResults).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((puVar9 == puVar5) &&
     (puVar5 = puVar9,
     (this->m_batchedResults).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
     _M_impl.super__Vector_impl_data._M_start ==
     (this->m_batchedResults).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
     _M_impl.super__Vector_impl_data._M_finish)) {
    pTVar2 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Draw call count: ",0x11);
    std::ostream::operator<<(poVar1,this->m_callCount);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Per call triangle count: ",0x19);
    std::ostream::operator<<(poVar1,this->m_triangleCount);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    puVar9 = (this->m_interleavedResults).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (this->m_interleavedResults).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if ((int)((ulong)((long)puVar5 - (long)puVar9) >> 3) < this->m_iterationCount) {
    uVar10 = (long)(this->m_batchedResults).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_batchedResults).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if ((ulong)((long)puVar5 - (long)puVar9) <= uVar10) {
      iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
      lVar6 = CONCAT44(extraout_var,iVar3);
      (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this,lVar6);
      (**(code **)(lVar6 + 0x648))();
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glFinish()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x247);
      dVar7 = deGetMicroseconds();
      (*(this->super_TestCase).super_TestNode._vptr_TestNode[6])(this,lVar6);
      (**(code **)(lVar6 + 0x648))();
      dVar8 = deGetMicroseconds();
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glFinish()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x250);
      local_1b0._0_8_ = dVar8 - dVar7;
      __position._M_current =
           (this->m_interleavedResults).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current !=
          (this->m_interleavedResults).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        *__position._M_current = local_1b0._0_8_;
        (this->m_interleavedResults).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
        return CONTINUE;
      }
      this_00 = &this->m_interleavedResults;
      goto LAB_00968960;
    }
  }
  else {
    uVar10 = (long)(this->m_batchedResults).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_batchedResults).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
  }
  if (this->m_iterationCount <= (int)(uVar10 >> 3)) {
    logAndSetTestResult(this);
    return STOP;
  }
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var_00,iVar3);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this,lVar6);
  (**(code **)(lVar6 + 0x648))();
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glFinish()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                  ,0x25e);
  dVar7 = deGetMicroseconds();
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])(this,lVar6);
  (**(code **)(lVar6 + 0x648))();
  dVar8 = deGetMicroseconds();
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glFinish()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                  ,0x267);
  local_1b0._0_8_ = dVar8 - dVar7;
  __position._M_current =
       (this->m_batchedResults).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current !=
      (this->m_batchedResults).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    *__position._M_current = local_1b0._0_8_;
    (this->m_batchedResults).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    return CONTINUE;
  }
  this_00 = &this->m_batchedResults;
LAB_00968960:
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
            (this_00,__position,(unsigned_long *)local_1b0);
  return CONTINUE;
}

Assistant:

tcu::TestCase::IterateResult StateChangePerformanceCase::iterate (void)
{
	if (m_interleavedResults.empty() && m_batchedResults.empty())
	{
		TestLog& log = m_testCtx.getLog();

		log << TestLog::Message << "Draw call count: " << m_callCount << TestLog::EndMessage;
		log << TestLog::Message << "Per call triangle count: " << m_triangleCount << TestLog::EndMessage;
	}

	// \note [mika] Interleave sampling to balance effects of powerstate etc.
	if ((int)m_interleavedResults.size() < m_iterationCount && m_batchedResults.size() >= m_interleavedResults.size())
	{
		const glw::Functions&	gl			= m_renderCtx.getFunctions();
		deUint64				resBeginUs	= 0;
		deUint64				resEndUs	= 0;

		setupInitialState(gl);
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish()");

		// Render result
		resBeginUs = deGetMicroseconds();

		renderTest(gl);

		gl.finish();
		resEndUs = deGetMicroseconds();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish()");

		m_interleavedResults.push_back(resEndUs - resBeginUs);

		return CONTINUE;
	}
	else if ((int)m_batchedResults.size() < m_iterationCount)
	{
		const glw::Functions&	gl			= m_renderCtx.getFunctions();
		deUint64				refBeginUs	= 0;
		deUint64				refEndUs	= 0;

		setupInitialState(gl);
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish()");

		// Render reference
		refBeginUs = deGetMicroseconds();

		renderReference(gl);

		gl.finish();
		refEndUs = deGetMicroseconds();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish()");

		m_batchedResults.push_back(refEndUs - refBeginUs);

		return CONTINUE;
	}
	else
	{
		logAndSetTestResult();
		return STOP;
	}
}